

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O0

fio_str_info_s *
fiobj_data_read2ch_slice(fio_str_info_s *__return_storage_ptr__,FIOBJ io,uint8_t token)

{
  undefined8 uVar1;
  size_t old_pos;
  uint8_t token_local;
  FIOBJ io_local;
  
  if (*(long *)(io + 0x28) == *(long *)(io + 0x20)) {
    memset(__return_storage_ptr__,0,0x18);
  }
  else {
    uVar1 = *(undefined8 *)(*(long *)(io + 0x10) + 0x28);
    *(long *)(*(long *)(io + 0x10) + 0x28) = *(long *)(io + 0x18) + *(long *)(io + 0x28);
    fiobj_data_read2ch(__return_storage_ptr__,*(FIOBJ *)(io + 0x10),token);
    *(undefined8 *)(*(long *)(io + 0x10) + 0x28) = uVar1;
    if (*(ulong *)(io + 0x20) < __return_storage_ptr__->len + *(long *)(io + 0x28)) {
      __return_storage_ptr__->len = *(long *)(io + 0x20) - *(long *)(io + 0x28);
      *(undefined8 *)(io + 0x28) = *(undefined8 *)(io + 0x20);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static fio_str_info_s fiobj_data_read2ch_slice(FIOBJ io, uint8_t token) {
  if (obj2io(io)->pos == obj2io(io)->len) /* EOF */
    return (fio_str_info_s){.data = NULL, .len = 0};
  size_t old_pos = obj2io(obj2io(io)->source.parent)->pos;
  obj2io(obj2io(io)->source.parent)->pos = obj2io(io)->capa + obj2io(io)->pos;
  fio_str_info_s tmp = fiobj_data_read2ch(obj2io(io)->source.parent, token);
  obj2io(obj2io(io)->source.parent)->pos = old_pos;
  if (tmp.len + obj2io(io)->pos > obj2io(io)->len) {
    /* EOF */
    tmp.len = obj2io(io)->len - obj2io(io)->pos;
    obj2io(io)->pos = obj2io(io)->len;
    return tmp;
  }
  return tmp;
}